

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

UVector * __thiscall
icu_63::ICUService::getDisplayNames
          (ICUService *this,UVector *result,Locale *locale,UnicodeString *matchID,UErrorCode *status
          )

{
  UnicodeString *value;
  UBool UVar1;
  char cVar2;
  int iVar3;
  DNCache *pDVar4;
  undefined4 extraout_var;
  UHashElement *pUVar5;
  StringPair *obj;
  Locale *p;
  UErrorCode *size;
  UnicodeString *pUVar6;
  DNCache *local_130;
  StringPair *sp;
  UnicodeString *dn;
  UnicodeString *id_1;
  UHashElement *entry;
  long *plStack_d8;
  int32_t pos;
  ICUServiceKey *matchKey;
  UnicodeString dname;
  ICUServiceFactory *f;
  UnicodeString *id;
  UHashElement *entry_1;
  int32_t pos_1;
  int local_64;
  Hashtable *local_60;
  Hashtable *m;
  Mutex local_48;
  Mutex mutex;
  ICUService *ncthis;
  UErrorCode *status_local;
  UnicodeString *matchID_local;
  Locale *locale_local;
  UVector *result_local;
  ICUService *this_local;
  
  UVector::removeAllElements(result);
  UVector::setDeleter(result,userv_deleteStringPair);
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    mutex.fMutex = (UMutex *)this;
    Mutex::Mutex(&local_48,(UMutex *)icu_63::lock);
    if ((this->dnCache != (DNCache *)0x0) &&
       (p = locale, UVar1 = Locale::operator!=(&this->dnCache->locale,locale), UVar1 != '\0')) {
      pDVar4 = this->dnCache;
      if (pDVar4 != (DNCache *)0x0) {
        DNCache::~DNCache(pDVar4);
        UMemory::operator_delete((UMemory *)pDVar4,p);
      }
      mutex.fMutex[2].fMutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    }
    if (this->dnCache == (DNCache *)0x0) {
      size = status;
      local_60 = getVisibleIDMap(this,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        pDVar4 = (DNCache *)UMemory::operator_new((UMemory *)0x140,(size_t)size);
        entry_1._7_1_ = 0;
        local_130 = (DNCache *)0x0;
        if (pDVar4 != (DNCache *)0x0) {
          entry_1._7_1_ = 1;
          _pos_1 = pDVar4;
          DNCache::DNCache(pDVar4,locale);
          local_130 = pDVar4;
        }
        mutex.fMutex[2].fMutex.__data.__list.__next = (__pthread_internal_list *)local_130;
        if (this->dnCache == (DNCache *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
          local_64 = 1;
          this_local = (ICUService *)result;
        }
        else {
          entry_1._0_4_ = 0xffffffff;
          do {
            pUVar5 = Hashtable::nextElement(local_60,(int32_t *)&entry_1);
            if (pUVar5 == (UHashElement *)0x0) goto LAB_0035ac1c;
            value = (UnicodeString *)(pUVar5->key).pointer;
            dname.fUnion._48_8_ = pUVar5->value;
            UnicodeString::UnicodeString((UnicodeString *)&matchKey);
            pUVar6 = value;
            (**(code **)(*(long *)dname.fUnion._48_8_ + 0x28))
                      (dname.fUnion._48_8_,value,locale,&matchKey);
            UVar1 = UnicodeString::isBogus((UnicodeString *)&matchKey);
            if (UVar1 == '\0') {
              pUVar6 = (UnicodeString *)&matchKey;
              Hashtable::put(&this->dnCache->cache,pUVar6,value,status);
              UVar1 = ::U_SUCCESS(*status);
              if (UVar1 == '\0') goto LAB_0035abb5;
              local_64 = 2;
            }
            else {
              *status = U_MEMORY_ALLOCATION_ERROR;
LAB_0035abb5:
              pDVar4 = this->dnCache;
              if (pDVar4 != (DNCache *)0x0) {
                DNCache::~DNCache(pDVar4);
                UMemory::operator_delete((UMemory *)pDVar4,pUVar6);
              }
              mutex.fMutex[2].fMutex.__data.__list.__next = (__pthread_internal_list *)0x0;
              local_64 = 1;
              this_local = (ICUService *)result;
            }
            UnicodeString::~UnicodeString((UnicodeString *)&matchKey);
          } while (local_64 == 2);
        }
      }
      else {
        local_64 = 1;
        this_local = (ICUService *)result;
      }
    }
    else {
LAB_0035ac1c:
      local_64 = 0;
    }
    Mutex::~Mutex(&local_48);
    if (local_64 != 0) {
      return (UVector *)this_local;
    }
  }
  iVar3 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,matchID,status);
  plStack_d8 = (long *)CONCAT44(extraout_var,iVar3);
  entry._4_4_ = 0xffffffff;
  do {
    do {
      pUVar5 = Hashtable::nextElement(&this->dnCache->cache,(int32_t *)((long)&entry + 4));
      if (pUVar5 == (UHashElement *)0x0) goto LAB_0035ad40;
      pUVar6 = (UnicodeString *)(pUVar5->value).pointer;
    } while ((plStack_d8 != (long *)0x0) &&
            (cVar2 = (**(code **)(*plStack_d8 + 0x40))(plStack_d8,pUVar6), cVar2 == '\0'));
    obj = StringPair::create(pUVar6,(UnicodeString *)(pUVar5->key).pointer,status);
    UVector::addElement(result,obj,status);
    UVar1 = ::U_FAILURE(*status);
  } while (UVar1 == '\0');
  UVector::removeAllElements(result);
LAB_0035ad40:
  if (plStack_d8 != (long *)0x0) {
    (**(code **)(*plStack_d8 + 8))();
  }
  return result;
}

Assistant:

UVector& 
ICUService::getDisplayNames(UVector& result, 
                            const Locale& locale, 
                            const UnicodeString* matchID, 
                            UErrorCode& status) const 
{
    result.removeAllElements();
    result.setDeleter(userv_deleteStringPair);
    if (U_SUCCESS(status)) {
        ICUService* ncthis = (ICUService*)this; // cast away semantic const
        Mutex mutex(&lock);

        if (dnCache != NULL && dnCache->locale != locale) {
            delete dnCache;
            ncthis->dnCache = NULL;
        }

        if (dnCache == NULL) {
            const Hashtable* m = getVisibleIDMap(status);
            if (U_FAILURE(status)) {
                return result;
            }
            ncthis->dnCache = new DNCache(locale); 
            if (dnCache == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return result;
            }

            int32_t pos = UHASH_FIRST;
            const UHashElement* entry = NULL;
            while ((entry = m->nextElement(pos)) != NULL) {
                const UnicodeString* id = (const UnicodeString*)entry->key.pointer;
                ICUServiceFactory* f = (ICUServiceFactory*)entry->value.pointer;
                UnicodeString dname;
                f->getDisplayName(*id, locale, dname);
                if (dname.isBogus()) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                } else {
                    dnCache->cache.put(dname, (void*)id, status); // share pointer with visibleIDMap
                    if (U_SUCCESS(status)) {
                        continue;
                    }
                }
                delete dnCache;
                ncthis->dnCache = NULL;
                return result;
            }
        }
    }

    ICUServiceKey* matchKey = createKey(matchID, status);
    /* To ensure that all elements in the hashtable are iterated, set pos to -1.
     * nextElement(pos) will skip the position at pos and begin the iteration
     * at the next position, which in this case will be 0.
     */
    int32_t pos = UHASH_FIRST; 
    const UHashElement *entry = NULL;
    while ((entry = dnCache->cache.nextElement(pos)) != NULL) {
        const UnicodeString* id = (const UnicodeString*)entry->value.pointer;
        if (matchKey != NULL && !matchKey->isFallbackOf(*id)) {
            continue;
        }
        const UnicodeString* dn = (const UnicodeString*)entry->key.pointer;
        StringPair* sp = StringPair::create(*id, *dn, status);
        result.addElement(sp, status);
        if (U_FAILURE(status)) {
            result.removeAllElements();
            break;
        }
    }
    delete matchKey;

    return result;
}